

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

bool __thiscall SimpleString::startsWith(SimpleString *this,SimpleString *other)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  bool bVar4;
  
  lVar2 = 0;
  do {
    pcVar1 = other->buffer_ + lVar2;
    lVar2 = lVar2 + 1;
  } while (*pcVar1 != '\0');
  bVar4 = true;
  if (lVar2 != 1) {
    pcVar1 = this->buffer_;
    lVar2 = 0;
    do {
      pcVar3 = pcVar1 + lVar2;
      lVar2 = lVar2 + 1;
    } while (*pcVar3 != '\0');
    if (lVar2 == 1) {
      bVar4 = false;
    }
    else {
      pcVar3 = StrStr(pcVar1,other->buffer_);
      bVar4 = pcVar3 == pcVar1;
    }
  }
  return bVar4;
}

Assistant:

const char* SimpleString::getBuffer() const
{
    return buffer_;
}